

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffrwrgll(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,LONGLONG *minrow,
            LONGLONG *maxrow,int *status)

{
  uint uVar1;
  ulong uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  double dVar9;
  char *local_50;
  int local_44;
  char *local_40;
  LONGLONG *local_38;
  
  if (0 < *status) {
    return *status;
  }
  if (0 < maxrows) {
    *numranges = 0;
    pcVar7 = rowlist + -1;
    do {
      cVar8 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while (cVar8 == ' ');
    uVar2 = 0;
    local_44 = maxranges;
    local_40 = rowlist;
    do {
      uVar5 = 1;
      local_50 = pcVar7;
      if (cVar8 != '-') {
        if (cVar8 == '\0') {
          if ((int)uVar2 == 0) {
            *minrow = 1;
            *maxrow = maxrows;
            *numranges = 1;
          }
          goto LAB_0013cfae;
        }
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar8 * 2 + 1) & 8) != 0) {
          dVar9 = strtod(pcVar7,&local_50);
          uVar5 = (ulong)(dVar9 + 0.1);
          pcVar7 = local_50;
          maxranges = local_44;
          goto LAB_0013ce50;
        }
LAB_0013cf7e:
        *status = 0x7e;
        pcVar7 = "Syntax error in this row range list:";
LAB_0013cf90:
        ffpmsg(pcVar7);
        pcVar7 = local_40;
        goto LAB_0013cfa9;
      }
LAB_0013ce50:
      for (; cVar8 = *pcVar7, cVar8 == ' '; pcVar7 = pcVar7 + 1) {
      }
      uVar4 = uVar5;
      if ((cVar8 != '\0') && (cVar8 != ',')) {
        if (cVar8 != '-') goto LAB_0013cf7e;
        do {
          cVar8 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        } while ((long)cVar8 == 0x20);
        local_50 = pcVar7;
        local_38 = maxrow;
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar8 * 2 + 1) & 8) == 0) {
          uVar4 = maxrows;
          maxrow = local_38;
          maxranges = local_44;
          pcVar7 = local_50;
          if ((cVar8 != '\0') && (cVar8 != ',')) goto LAB_0013cf7e;
        }
        else {
          dVar9 = strtod(pcVar7,&local_50);
          uVar4 = (long)(dVar9 + 0.1);
          maxrow = local_38;
          maxranges = local_44;
          pcVar7 = local_50;
        }
      }
      local_50 = pcVar7;
      pcVar7 = local_40;
      uVar1 = *numranges;
      uVar2 = (ulong)uVar1;
      if (maxranges <= (int)uVar1) {
        *status = 0x7e;
        pcVar7 = "Overflowed maximum number of ranges (fits_parse_ranges)";
        goto LAB_0013cfa9;
      }
      if ((long)uVar5 < 1) {
        *status = 0x7e;
        pcVar7 = "Syntax error in this row range list: row number < 1";
        goto LAB_0013cf90;
      }
      if ((long)uVar4 < (long)uVar5) {
        *status = 0x7e;
        pcVar6 = "Syntax error in this row range list: min > max";
        goto LAB_0013d036;
      }
      if ((0 < (int)uVar1) && ((long)uVar5 <= maxrow[uVar2 - 1])) goto LAB_0013d018;
      if ((long)uVar5 <= maxrows) {
        if ((ulong)maxrows <= uVar4) {
          uVar4 = maxrows;
        }
        minrow[(int)uVar1] = uVar5;
        maxrow[(int)uVar1] = uVar4;
        uVar2 = (ulong)(uVar1 + 1);
        *numranges = uVar1 + 1;
      }
      for (; *local_50 == ' '; local_50 = local_50 + 1) {
      }
      pcVar7 = local_50;
      if (*local_50 == ',') {
        do {
          pcVar7 = local_50 + 1;
          pcVar6 = local_50 + 1;
          local_50 = pcVar7;
        } while (*pcVar6 == ' ');
      }
      cVar8 = *pcVar7;
    } while( true );
  }
  *status = 0x7e;
  pcVar7 = "Input maximum range value is <= 0 (fits_parse_ranges)";
LAB_0013cfa9:
  ffpmsg(pcVar7);
LAB_0013cfae:
  return *status;
LAB_0013d018:
  *status = 0x7e;
  ffpmsg("Syntax error in this row range list.  Range minimum is");
  pcVar6 = "  less than or equal to previous range maximum";
LAB_0013d036:
  ffpmsg(pcVar6);
  goto LAB_0013cfa9;
}

Assistant:

int ffrwrgll(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the list */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      LONGLONG *minrow,       /* O - first row in each range */
      LONGLONG *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    LONGLONG minval, maxval;
    double dvalue;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {

        /* read as a double, because the string to LONGLONG function */
        /* is platform dependent (strtoll, strtol, _atoI64)          */

          dvalue = strtod(next, &next);
          minval = (LONGLONG) (dvalue + 0.1);

      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {

            /* read as a double, because the string to LONGLONG function */
            /* is platform dependent (strtoll, strtol, _atoI64)          */

              dvalue = strtod(next, &next);
              maxval = (LONGLONG) (dvalue + 0.1);

          } else if (*next == ',' || *next == '\0') {
              maxval = maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = maxrows;
         *numranges = 1;
    }

    return(*status);
}